

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void CVmPack::parse_type(CVmPackPos *p,CVmPackType *info,CVmPackGroup *group)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  wchar_t wVar4;
  int iVar5;
  void *pvVar6;
  uint uVar7;
  
  wVar4 = CVmPackPos::nextch(p);
  if (wVar4 < L'\x80') {
    pvVar6 = memchr("aAbuUwWhHcCsSlLqQkfdxX@\"{",(int)(char)wVar4,0x1a);
    if (pvVar6 != (void *)0x0) {
      info->fmtidx = p->idx + -1;
      info->type_code = wVar4;
      if (wVar4 == L'{') {
        (info->lit).p.p_ = (p->p).p_;
        (info->lit).len = p->len;
        (info->lit).idx = p->idx;
        while( true ) {
          iVar5 = CVmPackPos::more(p);
          if (iVar5 == 0) break;
          wVar4 = CVmPackPos::getch(p);
          if (wVar4 == L'}') {
            psVar1 = &(info->lit).len;
            *psVar1 = *psVar1 - p->len;
            CVmPackPos::inc(p);
            goto LAB_002685ff;
          }
          wVar4 = CVmPackPos::getch(p);
          iVar5 = is_xdigit(wVar4);
          if (iVar5 == 0) {
            err_throw_a(0x6b,0,(ulong)(uint)p->idx);
          }
          CVmPackPos::inc(p);
        }
      }
      else {
        if (wVar4 != L'\"') {
LAB_002685ff:
          info->big_endian = group->big_endian;
          info->tilde = group->tilde;
          info->pct = group->pct;
          info->count = -1;
          info->count_in_bytes = 0;
          info->count_as_type = L'\0';
          info->qu = 0;
          info->null_term = 0;
          info->bang = 0;
          parse_mods(p,info);
          return;
        }
        (info->lit).p.p_ = (p->p).p_;
        (info->lit).len = p->len;
        (info->lit).idx = p->idx;
        while( true ) {
          iVar5 = CVmPackPos::more(p);
          if (iVar5 == 0) break;
          wVar4 = CVmPackPos::getch(p);
          if (wVar4 == L'\"') {
            sVar2 = (info->lit).len;
            sVar3 = p->len;
            CVmPackPos::inc(p);
            wVar4 = CVmPackPos::getch(p);
            if (wVar4 != L'\"') {
              (info->lit).len = sVar2 - sVar3;
              goto LAB_002685ff;
            }
          }
          CVmPackPos::inc(p);
        }
      }
      uVar7 = p->idx;
      goto LAB_0026864b;
    }
  }
  uVar7 = p->idx - 1;
LAB_0026864b:
  err_throw_a(0x6b,1,0,(ulong)uVar7);
}

Assistant:

void CVmPack::parse_type(CVmPackPos *p, CVmPackType *info,
                         const CVmPackGroup *group)
{
    /* get the type code */
    wchar_t c = p->nextch();
    if (!is_valid_type(c))
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index() - 1);

    /* set the format string index */
    info->fmtidx = p->index() - 1;

    /* this is the type code - save it */
    info->type_code = c;

    /* 
     *   if it's a quote, parse the characters to the next quote; if it's an
     *   open brace, parse the hex digits to the close brace 
     */
    if (c == '"')
    {
        /* note the start of the literal section */
        info->lit.set(p);
        
        /* scan for the closing quote */
        for ( ; ; p->inc())
        {
            /* if at end of string, it's an error */
            if (!p->more())
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* check for the close quote */
            if (p->getch() == '"')
            {
                /* this might be it - note the length if so */
                size_t len = info->lit.len - p->len;

                /* skip it */
                p->inc();

                /* if it's not a stuttered quote, it's really the end */
                if (p->getch() != '"')
                {
                    info->lit.len = len;
                    break;
                }
            }
        }
    }
    else if (c == '{')
    {
        /* note the start of the literal section */
        info->lit.set(p);
        
        /* scan for the closing brace - only hex digits are allowed */
        for ( ; ; p->inc())
        {
            /* if at end of string, it's an error */
            if (!p->more())
                err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p->index());

            /* make sure it's a hex digit or close brace */
            if (p->getch() == '}')
            {
                /* it's the close brace - note it, skip it, and we're done */
                info->lit.len -= p->len;
                p->inc();
                break;
            }
            else if (!is_xdigit(p->getch()))
                err_throw_a(VMERR_PACK_PARSE, ERR_TYPE_INT, p->index());
        }
    }

    /* set the default modifiers */
    info->big_endian = group->big_endian;
    info->tilde = group->tilde;
    info->pct = group->pct;
    info->count = ITER_NONE;
    info->count_as_type = 0;
    info->count_in_bytes = FALSE;
    info->bang = info->qu = FALSE;
    info->null_term = FALSE;

    /* check for modifiers */
    parse_mods(p, info);
}